

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall
ANN::set_labels(ANN *this,LayerType label_type,
               initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *labels)

{
  size_type sVar1;
  reference this_00;
  uint local_24;
  uint index;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *labels_local;
  LayerType label_type_local;
  ANN *this_local;
  
  if (label_type == InputLayer) {
    local_24 = 0;
  }
  else if (label_type == OutputLayer) {
    sVar1 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
    local_24 = (int)sVar1 - 1;
  }
  this_00 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,(ulong)local_24);
  Layer::set_labels(this_00,labels);
  return;
}

Assistant:

void ANN::set_labels(LayerType label_type, const std::initializer_list<std::string>& labels){
    uint index;
    switch (label_type)
    {
    case InputLayer:
        index=0;
        break;
    case OutputLayer:
        index=m_layers.size()-1;
        break;
    default: break;
    }
    m_layers[index].set_labels(labels);
}